

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::DestroyProtos(RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  long *plVar2;
  LogMessage *pLVar3;
  int local_ac;
  int i;
  void **elements;
  int n;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  RepeatedPtrFieldBase *local_10;
  RepeatedPtrFieldBase *this_local;
  
  local_49 = 0;
  local_10 = this;
  if (this->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x66);
    local_49 = 1;
    pLVar3 = LogMessage::operator<<(&local_48,"CHECK failed: rep_: ");
    LogFinisher::operator=(local_5d,pLVar3);
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage(&local_48);
  }
  elements._7_1_ = 0;
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&n,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x67);
    elements._7_1_ = 1;
    pLVar3 = LogMessage::operator<<((LogMessage *)&n,"CHECK failed: arena_ == nullptr: ");
    LogFinisher::operator=((LogFinisher *)((long)&elements + 6),pLVar3);
  }
  if ((elements._7_1_ & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)&n);
  }
  elements._0_4_ = this->rep_->allocated_size;
  pRVar1 = this->rep_;
  for (local_ac = 0; local_ac < (int)elements; local_ac = local_ac + 1) {
    plVar2 = (long *)pRVar1->elements[local_ac];
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  operator_delete(this->rep_);
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::DestroyProtos() {
  GOOGLE_DCHECK(rep_);
  GOOGLE_DCHECK(arena_ == nullptr);
  int n = rep_->allocated_size;
  void* const* elements = rep_->elements;
  for (int i = 0; i < n; i++) {
    delete static_cast<MessageLite*>(elements[i]);
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
  ::operator delete(static_cast<void*>(rep_), size);
  rep_ = nullptr;
#else
  ::operator delete(static_cast<void*>(rep_));
  rep_ = nullptr;
#endif
}